

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# completion_condition.hpp
# Opt level: O0

size_t __thiscall
asio::detail::transfer_exactly_t::operator()
          (transfer_exactly_t *this,error_code *err,size_t bytes_transferred)

{
  bool bVar1;
  ulong in_RDX;
  error_code *in_RSI;
  ulong *in_RDI;
  undefined8 local_30;
  undefined8 local_28;
  
  bVar1 = std::error_code::operator_cast_to_bool(in_RSI);
  if ((bVar1) || (*in_RDI <= in_RDX)) {
    local_28 = 0;
  }
  else {
    if (*in_RDI - in_RDX < 0x10000) {
      local_30 = *in_RDI - in_RDX;
    }
    else {
      local_30 = 0x10000;
    }
    local_28 = local_30;
  }
  return local_28;
}

Assistant:

std::size_t operator()(const Error& err, std::size_t bytes_transferred)
  {
    return (!!err || bytes_transferred >= size_) ? 0 :
      (size_ - bytes_transferred < default_max_transfer_size
        ? size_ - bytes_transferred : std::size_t(default_max_transfer_size));
  }